

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rom.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_32777e::RomFactory_fails_if_mapper_not_supported_Test::
~RomFactory_fails_if_mapper_not_supported_Test(RomFactory_fails_if_mapper_not_supported_Test *this)

{
  RomFactory_fails_if_mapper_not_supported_Test *this_local;
  
  ~RomFactory_fails_if_mapper_not_supported_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(RomFactory, fails_if_mapper_not_supported) {
    std::string bytes{ines_header_bytes(0xCD, 0, 0, 0)};
    std::stringstream ss(bytes);
    EXPECT_THAT([&ss]() { auto tmp = RomFactory::from_bytes(ss); },
            testing::Throws<std::logic_error>(
                    testing::Property(&std::logic_error::what,
                            testing::HasSubstr("Unsupported mapper: 205"))));
}